

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

void __thiscall viface::VIfaceImpl::VIfaceImpl(VIfaceImpl *this,string *name,bool tap,int id)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  invalid_argument *this_00;
  char *pcVar4;
  ostream *poVar5;
  int *piVar6;
  runtime_error *prVar7;
  string local_410 [32];
  ostringstream local_3f0 [8];
  ostringstream what_1;
  string local_270 [32];
  ostringstream local_250 [8];
  ostringstream what;
  string local_d8 [32];
  viface local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  viface_queues local_38;
  viface_queues queues;
  int id_local;
  bool tap_local;
  string *name_local;
  VIfaceImpl *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pktbuff);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->mac);
  std::__cxx11::string::string((string *)&this->ipv4);
  std::__cxx11::string::string((string *)&this->netmask);
  std::__cxx11::string::string((string *)&this->broadcast);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ipv6s);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->stats_keys_cache);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->stats_cache);
  uVar3 = std::__cxx11::string::length();
  if (0xf < uVar3) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"--- Virtual interface name too long.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_38.rx = 0;
  local_38.tx = 0;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "/sys/class/net/");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar1 = access(pcVar4,0);
  std::__cxx11::string::~string(local_58);
  if (iVar1 == 0) {
    std::__cxx11::string::string(local_78,(string *)name);
    hook_viface((string *)local_78,&local_38);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::operator=((string *)&this->name,(string *)name);
    std::__cxx11::string::string(local_98,(string *)name);
    uVar2 = read_mtu((string *)local_98,4);
    this->mtu = uVar2;
    std::__cxx11::string::~string(local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->pktbuff,(ulong)this->mtu);
  }
  else {
    std::__cxx11::string::string(local_d8,(string *)name);
    alloc_viface(local_b8,(string *)local_d8,tap,&local_38);
    std::__cxx11::string::operator=((string *)&this->name,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string(local_d8);
    this->mtu = 0x5dc;
  }
  this->queues = local_38;
  this->kernel_socket = -1;
  iVar1 = socket(2,1,0);
  this->kernel_socket = iVar1;
  if (this->kernel_socket < 0) {
    std::__cxx11::ostringstream::ostringstream(local_250);
    std::operator<<((ostream *)local_250,
                    "--- Unable to create IPv4 socket channel to the NET kernel.");
    std::ostream::operator<<((ostream *)local_250,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)local_250,"    Error: ");
    piVar6 = __errno_location();
    pcVar4 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<((ostream *)local_250," (");
    piVar6 = __errno_location();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,").");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_270);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->kernel_socket_ipv6 = -1;
  iVar1 = socket(10,1,0);
  this->kernel_socket_ipv6 = iVar1;
  if (this->kernel_socket_ipv6 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_3f0);
    std::operator<<((ostream *)local_3f0,
                    "--- Unable to create IPv6 socket channel to the NET kernel.");
    std::ostream::operator<<((ostream *)local_3f0,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)local_3f0,"    Error: ");
    piVar6 = __errno_location();
    pcVar4 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<((ostream *)local_3f0," (");
    piVar6 = __errno_location();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5,").");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_410);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (id < 0) {
    this->id = idseq;
  }
  else {
    this->id = id;
  }
  idseq = idseq + 1;
  return;
}

Assistant:

VIfaceImpl::VIfaceImpl(string name, bool tap, int id)
{
    // Check name length
    if (name.length() >= IFNAMSIZ) {
        throw invalid_argument("--- Virtual interface name too long.");
    }

    // Create queues
    struct viface_queues queues;
    memset(&queues, 0, sizeof(struct viface_queues));

    /* Checks if the path name can be accessed. If so,
     * it means that the network interface is already defined.
     */
    if (access(("/sys/class/net/" + name).c_str(), F_OK) == 0) {
        hook_viface(name, &queues);
        this->name = name;

        // Read MTU value and resize buffer
        this->mtu = read_mtu(name, sizeof(this->mtu));
        this->pktbuff.resize(this->mtu);
    } else {
        this->name = alloc_viface(name, tap, &queues);

        // Other defaults
        this->mtu = 1500;
    }

    this->queues = queues;

    // Create socket channels to the NET kernel for later ioctl
    this->kernel_socket = -1;
    this->kernel_socket = socket(AF_INET, SOCK_STREAM, 0);
    if (this->kernel_socket < 0) {
        ostringstream what;
        what << "--- Unable to create IPv4 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    this->kernel_socket_ipv6 = -1;
    this->kernel_socket_ipv6 = socket(AF_INET6, SOCK_STREAM, 0);
    if (this->kernel_socket_ipv6 < 0) {
        ostringstream what;
        what << "--- Unable to create IPv6 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Set id
    if (id < 0) {
        this->id = this->idseq;
    } else {
        this->id = id;
    }
    this->idseq++;
}